

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::StringPieceToRune(Rune *r,StringPiece *sp,RegexpStatus *status)

{
  RegexpStatus *this;
  StringPiece *rune;
  int iVar1;
  const_pointer pcVar2;
  unsigned_long *puVar3;
  StringPiece local_50;
  int local_3c;
  size_type sStack_38;
  int n;
  unsigned_long local_30;
  RegexpStatus *local_28;
  RegexpStatus *status_local;
  StringPiece *sp_local;
  Rune *r_local;
  
  local_28 = status;
  status_local = (RegexpStatus *)sp;
  sp_local = (StringPiece *)r;
  pcVar2 = StringPiece::data(sp);
  local_30 = 4;
  sStack_38 = StringPiece::size((StringPiece *)status_local);
  puVar3 = std::min<unsigned_long>(&local_30,&stack0xffffffffffffffc8);
  iVar1 = fullrune(pcVar2,(int)*puVar3);
  rune = sp_local;
  if (iVar1 != 0) {
    pcVar2 = StringPiece::data((StringPiece *)status_local);
    local_3c = chartorune((Rune *)rune,pcVar2);
    if (0x10ffff < *(int *)&sp_local->data_) {
      local_3c = 1;
      *(undefined4 *)&sp_local->data_ = 0xfffd;
    }
    if ((local_3c != 1) || (*(int *)&sp_local->data_ != 0xfffd)) {
      StringPiece::remove_prefix((StringPiece *)status_local,(long)local_3c);
      return local_3c;
    }
  }
  if (local_28 != (RegexpStatus *)0x0) {
    RegexpStatus::set_code(local_28,kRegexpBadUTF8);
    this = local_28;
    StringPiece::StringPiece(&local_50);
    RegexpStatus::set_error_arg(this,&local_50);
  }
  return -1;
}

Assistant:

static int StringPieceToRune(Rune *r, StringPiece *sp, RegexpStatus* status) {
  // fullrune() takes int, not size_t. However, it just looks
  // at the leading byte and treats any length >= 4 the same.
  if (fullrune(sp->data(), static_cast<int>(std::min(size_t{4}, sp->size())))) {
    int n = chartorune(r, sp->data());
    // Some copies of chartorune have a bug that accepts
    // encodings of values in (10FFFF, 1FFFFF] as valid.
    // Those values break the character class algorithm,
    // which assumes Runemax is the largest rune.
    if (*r > Runemax) {
      n = 1;
      *r = Runeerror;
    }
    if (!(n == 1 && *r == Runeerror)) {  // no decoding error
      sp->remove_prefix(n);
      return n;
    }
  }

  if (status != NULL) {
    status->set_code(kRegexpBadUTF8);
    status->set_error_arg(StringPiece());
  }
  return -1;
}